

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O2

void __thiscall cornerstone::rpc_session::~rpc_session(rpc_session *this)

{
  int in_ESI;
  
  if ((this->socket_).super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.implementation_
      .super_base_implementation_type.socket_ != -1) {
    asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>::close
              (&(this->socket_).super_basic_socket<asio::ip::tcp,_asio::any_io_executor>,in_ESI);
  }
  std::_Function_base::~_Function_base(&(this->callback_).super__Function_base);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>::~unique_ptr(&this->header_)
  ;
  std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>::~unique_ptr
            (&this->log_data_);
  asio::detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
  ~io_object_impl((io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
                   *)&this->socket_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->handler_).
              super___shared_ptr<cornerstone::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_enable_shared_from_this<cornerstone::rpc_session>)._M_weak_this.
              super___weak_ptr<cornerstone::rpc_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

~rpc_session()
    {
        if (socket_.is_open())
        {
            socket_.close();
        }
    }